

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

void __thiscall
helics::InputInfo::removeSource(InputInfo *this,GlobalHandle sourceToRemove,Time minTime)

{
  bool bVar1;
  GlobalHandle *pGVar2;
  reference this_00;
  reference pvVar3;
  baseType in_RDX;
  GlobalHandle in_RDI;
  size_t ii;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar4;
  GlobalHandle *this_01;
  GlobalHandle *local_20;
  TimeRepresentation<count_time<9,_long>_> local_10 [2];
  
  local_10[0].internalTimeCode = in_RDX;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5c8c69);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5c8c7a);
  local_20 = (GlobalHandle *)0x0;
  while (this_01 = local_20,
        pGVar2 = (GlobalHandle *)
                 std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::size
                           ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                            ((long)in_RDI + 0xb0)), this_01 < pGVar2) {
    std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::operator[]
              ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
               ((long)in_RDI + 0xb0),(size_type)local_20);
    bVar1 = GlobalHandle::operator==(this_01,in_RDI);
    if (bVar1) {
      while( true ) {
        std::
        vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
        ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                      *)((long)in_RDI + 0x110),(size_type)local_20);
        bVar1 = std::
                vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                ::empty((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                         *)in_RDI);
        uVar4 = false;
        if (!bVar1) {
          std::
          vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
          ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                        *)((long)in_RDI + 0x110),(size_type)local_20);
          this_00 = std::
                    vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                    ::back((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                            *)CONCAT17(uVar4,in_stack_ffffffffffffffc0));
          uVar4 = TimeRepresentation<count_time<9,_long>_>::operator>(&this_00->time,local_10);
        }
        if ((bool)uVar4 == false) break;
        std::
        vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
        ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                      *)((long)in_RDI + 0x110),(size_type)local_20);
        std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>::
        pop_back((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                  *)0x5c8d69);
      }
      pvVar3 = std::
               vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
               ::operator[]((vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                             *)((long)in_RDI + 200),(size_type)local_20);
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(local_10,pvVar3);
      if (bVar1) {
        pvVar3 = std::
                 vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                 ::operator[]((vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                               *)((long)in_RDI + 200),(size_type)local_20);
        pvVar3->internalTimeCode = local_10[0].internalTimeCode;
      }
    }
    local_20 = (GlobalHandle *)((long)&(local_20->fed_id).gid + 1);
  }
  return;
}

Assistant:

void InputInfo::removeSource(GlobalHandle sourceToRemove, Time minTime)
{
    // the inputUnits and type are not determined anymore since the source list has changed
    inputUnits.clear();
    inputType.clear();
    for (size_t ii = 0; ii < input_sources.size(); ++ii) {
        if (input_sources[ii] == sourceToRemove) {
            while ((!data_queues[ii].empty()) && (data_queues[ii].back().time > minTime)) {
                data_queues[ii].pop_back();
            }
            if (minTime < deactivated[ii]) {
                deactivated[ii] = minTime;
            }
        }
        // there could be duplicate sources so we need to do the full loop
    }
}